

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QSimplexVariable*,double>::emplace_helper<double_const&>
          (QHash<QSimplexVariable*,double> *this,QSimplexVariable **key,double *args)

{
  byte bVar1;
  Entry *pEVar2;
  piter pVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::findOrInsert<QSimplexVariable*>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QSimplexVariable*,double>> **)this,key);
  pEVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    lVar4 = (ulong)bVar1 * 0x10;
    *(QSimplexVariable **)pEVar2[bVar1].storage.data = *key;
    uVar5 = SUB84(*args,0);
    uVar6 = (undefined4)((ulong)*args >> 0x20);
  }
  else {
    uVar5 = SUB84(*args,0);
    uVar6 = (undefined4)((ulong)*args >> 0x20);
    lVar4 = (ulong)bVar1 << 4;
  }
  *(ulong *)((pEVar2->storage).data + lVar4 + 8) = CONCAT44(uVar6,uVar5);
  pVar3.bucket = local_38._8_8_;
  pVar3.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }